

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void google::protobuf::compiler::js::FindProvidesForOneOfEnums
               (GeneratorOptions *options,Printer *printer,Descriptor *desc,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *provided)

{
  bool bVar1;
  long lVar2;
  int i;
  long lVar3;
  
  bVar1 = anon_unknown_0::HasOneofFields(desc);
  if (bVar1) {
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < *(int *)(desc + 0x68); lVar3 = lVar3 + 1) {
      bVar1 = anon_unknown_0::IgnoreOneof((OneofDescriptor *)(*(long *)(desc + 0x30) + lVar2));
      if (!bVar1) {
        FindProvidesForOneOfEnum
                  (options,(OneofDescriptor *)(*(long *)(desc + 0x30) + lVar2),provided);
      }
      lVar2 = lVar2 + 0x28;
    }
  }
  return;
}

Assistant:

void FindProvidesForOneOfEnums(const GeneratorOptions& options,
                               io::Printer* printer, const Descriptor* desc,
                               std::set<std::string>* provided) {
  if (HasOneofFields(desc)) {
    for (int i = 0; i < desc->oneof_decl_count(); i++) {
      if (IgnoreOneof(desc->oneof_decl(i))) {
        continue;
      }
      FindProvidesForOneOfEnum(options, desc->oneof_decl(i), provided);
    }
  }
}